

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall S2Polygon::Invert(S2Polygon *this)

{
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *this_00;
  int *piVar1;
  pointer puVar2;
  S2Loop *pSVar3;
  pointer pVVar4;
  pointer pVVar5;
  int iVar6;
  pointer puVar7;
  ulong uVar8;
  long lVar9;
  pointer pVVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  new_loops;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_68;
  S2LogMessage local_50;
  double local_40;
  double local_38;
  
  this_00 = &this->loops_;
  puVar7 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 == puVar2) {
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    (((__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true> *)
     (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start)->c_)->
    super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>)._M_t.
    super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_> =
         (_Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>)0x0;
    ((__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true> *)
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_)[1] =
         (__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>)0x0;
    ((__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true> *)
    (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_start)->c_)[2] =
         (__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>)0xbff0000000000000;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_50,&local_68);
    std::
    vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
    ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
              ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                *)this_00,(unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_50);
    if ((_Head_base<0UL,_S2Loop_*,_false>)local_50._0_8_ != (_Head_base<0UL,_S2Loop_*,_false>)0x0) {
      S2Loop::~S2Loop((S2Loop *)local_50._0_8_);
      operator_delete((void *)local_50._0_8_);
    }
    local_50._0_8_ = (S2Loop *)0x0;
    if (local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  else if (((((long)puVar2 - (long)puVar7 & 0x7fffffff8U) == 8) &&
           (pSVar3 = (puVar7->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t
                     .super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                     super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl, pSVar3->num_vertices_ == 1
           )) && ((pSVar3->origin_inside_ & 1U) != 0)) {
    ClearLoops(this);
  }
  else {
    puVar7 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = 0;
    if (1 < (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 3)) {
      uVar8 = 0;
      dVar14 = 10.0;
      uVar13 = 1;
      do {
        if (*(int *)((long)puVar7[uVar13]._M_t.
                           super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 8) ==
            0) {
          if ((dVar14 == 10.0) && (!NAN(dVar14))) {
            dVar14 = S2Loop::GetCurvature
                               ((S2Loop *)
                                puVar7[(int)uVar8]._M_t.
                                super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t);
          }
          local_40 = dVar14;
          dVar15 = S2Loop::GetCurvature
                             ((S2Loop *)
                              (this_00->
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_t.
                              super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>);
          if (local_40 <= dVar15) {
            dVar14 = local_40;
            if ((dVar15 == local_40) && (!NAN(dVar15) && !NAN(local_40))) {
              puVar7 = (this_00->
                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_38 = dVar15;
              iVar6 = CompareLoops((S2Loop *)
                                   puVar7[uVar13]._M_t.
                                   super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>,
                                   (S2Loop *)
                                   puVar7[(int)uVar8]._M_t.
                                   super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>);
              dVar14 = local_40;
              dVar15 = local_38;
              if (iVar6 < 0) goto LAB_0020ba10;
            }
          }
          else {
LAB_0020ba10:
            uVar8 = uVar13 & 0xffffffff;
            dVar14 = dVar15;
          }
        }
        iVar6 = (int)uVar8;
        uVar13 = uVar13 + 1;
        puVar7 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar13 <
               (long)(int)((ulong)((long)(this->loops_).
                                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7)
                          >> 3));
    }
    lVar12 = (long)iVar6;
    S2Loop::Invert((S2Loop *)
                   puVar7[lVar12]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>.
                   _M_t);
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ::reserve((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               *)&local_68,
              (long)(int)((ulong)((long)(this->loops_).
                                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->loops_).
                                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3));
    iVar6 = GetLastDescendant(this,iVar6);
    std::
    vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
    ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
              ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                *)&local_68,
               (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar12);
    puVar7 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 3)) {
      lVar11 = 0;
      lVar9 = 0;
      do {
        if (lVar9 < lVar12 || iVar6 < lVar9) {
          piVar1 = (int *)(*(long *)((long)&(puVar7->_M_t).
                                            super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>
                                            ._M_t + lVar11) + 8);
          *piVar1 = *piVar1 + 1;
          std::
          vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
          ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                    ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                      *)&local_68,
                     (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
                     ((long)&(puVar7->_M_t).
                             super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t +
                     lVar11));
        }
        lVar9 = lVar9 + 1;
        puVar7 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 8;
      } while (lVar9 < (int)((ulong)((long)(this->loops_).
                                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7
                                    ) >> 3));
    }
    pVVar10 = (pointer)(this->loops_).
                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10) >> 3)) {
      lVar11 = 0;
      lVar9 = 0;
      do {
        if (lVar9 <= iVar6 && lVar12 < lVar9) {
          piVar1 = (int *)(*(long *)((long)&(((__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true>
                                               *)pVVar10->c_)->
                                            super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>
                                            )._M_t.
                                            super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>
                                    + lVar11) + 8);
          *piVar1 = *piVar1 + -1;
          std::
          vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
          ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                    ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                      *)&local_68,
                     (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
                     ((long)&(((__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true> *)
                              pVVar10->c_)->
                             super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>)._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_> + lVar11
                     ));
        }
        lVar9 = lVar9 + 1;
        pVVar10 = (pointer)(this->loops_).
                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 8;
      } while (lVar9 < (int)((ulong)((long)(this->loops_).
                                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pVVar10) >> 3));
    }
    pVVar4 = (pointer)(this->loops_).
                      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    pVVar5 = (pointer)(this->loops_).
                      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->loops_).
    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    (this->loops_).
    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    (this->loops_).
    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar4;
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pVVar5;
    if ((long)pVVar4 - (long)pVVar10 >> 3 !=
        (long)(int)((ulong)((long)(this->loops_).
                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_68.
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar10;
      S2LogMessage::S2LogMessage
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                 ,0x357,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_50.stream_,"Check failed: (new_loops.size()) == (num_loops()) ",0x32);
      abort();
    }
    local_68.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar10;
    std::
    vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ::~vector((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               *)&local_68);
  }
  (this->unindexed_contains_calls_).super___atomic_base<int>._M_i = 0;
  MutableS2ShapeIndex::Clear(&this->index_);
  InitLoopProperties(this);
  return;
}

Assistant:

void S2Polygon::Invert() {
  // Inverting any one loop will invert the polygon.  The best loop to invert
  // is the one whose area is largest, since this yields the smallest area
  // after inversion.  The loop with the largest area is always at depth 0.
  // The descendents of this loop all have their depth reduced by 1, while the
  // former siblings of this loop all have their depth increased by 1.

  // The empty and full polygons are handled specially.
  if (is_empty()) {
    loops_.push_back(make_unique<S2Loop>(S2Loop::kFull()));
  } else if (is_full()) {
    ClearLoops();
  } else {
    // Find the loop whose area is largest (i.e., whose curvature is
    // smallest), minimizing calls to GetCurvature().  In particular, for
    // polygons with a single shell at level 0 there is not need to call
    // GetCurvature() at all.  (This method is relatively expensive.)
    int best = 0;
    const double kNone = 10.0;  // Flag that means "not computed yet"
    double best_angle = kNone;
    for (int i = 1; i < num_loops(); ++i) {
      if (loop(i)->depth() == 0) {
        // We defer computing the curvature of loop 0 until we discover
        // that the polygon has another top-level shell.
        if (best_angle == kNone) best_angle = loop(best)->GetCurvature();
        double angle = loop(i)->GetCurvature();
        // We break ties deterministically in order to avoid having the output
        // depend on the input order of the loops.
        if (angle < best_angle ||
            (angle == best_angle && CompareLoops(loop(i), loop(best)) < 0)) {
          best = i;
          best_angle = angle;
        }
      }
    }
    // Build the new loops vector, starting with the inverted loop.
    loop(best)->Invert();
    vector<unique_ptr<S2Loop>> new_loops;
    new_loops.reserve(num_loops());
    // Add the former siblings of this loop as descendants.
    int last_best = GetLastDescendant(best);
    new_loops.push_back(std::move(loops_[best]));
    for (int i = 0; i < num_loops(); ++i) {
      if (i < best || i > last_best) {
        loop(i)->set_depth(loop(i)->depth() + 1);
        new_loops.push_back(std::move(loops_[i]));
      }
    }
    // Add the former children of this loop as siblings.
    for (int i = 0; i < num_loops(); ++i) {
      if (i > best && i <= last_best) {
        loop(i)->set_depth(loop(i)->depth() - 1);
        new_loops.push_back(std::move(loops_[i]));
      }
    }
    loops_.swap(new_loops);
    S2_DCHECK_EQ(new_loops.size(), num_loops());
  }
  ClearIndex();
  InitLoopProperties();
}